

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EntityComponentStore.cpp
# Opt level: O0

void __thiscall EntityComponentStoreTests::Run(EntityComponentStoreTests *this)

{
  anon_class_8_1_8991fb9c local_390;
  function<void_()> local_388;
  allocator local_361;
  string local_360 [32];
  anon_class_8_1_8991fb9c local_340;
  function<void_()> local_338;
  allocator local_311;
  string local_310 [32];
  anon_class_8_1_8991fb9c local_2f0;
  function<void_()> local_2e8;
  allocator local_2c1;
  string local_2c0 [32];
  anon_class_8_1_8991fb9c local_2a0;
  function<void_()> local_298;
  allocator local_271;
  string local_270 [32];
  anon_class_8_1_8991fb9c local_250;
  function<void_()> local_248;
  allocator local_221;
  string local_220 [32];
  anon_class_8_1_8991fb9c local_200;
  function<void_()> local_1f8;
  allocator local_1d1;
  string local_1d0 [32];
  anon_class_8_1_8991fb9c local_1b0;
  function<void_()> local_1a8;
  allocator local_181;
  string local_180 [32];
  anon_class_8_1_8991fb9c local_160;
  function<void_()> local_158;
  allocator local_131;
  string local_130 [32];
  anon_class_8_1_8991fb9c local_110;
  function<void_()> local_108;
  allocator local_e1;
  string local_e0 [32];
  anon_class_8_1_8991fb9c local_c0;
  function<void_()> local_b8;
  allocator local_91;
  string local_90 [32];
  anon_class_8_1_8991fb9c local_70;
  function<void_()> local_68;
  allocator local_31;
  string local_30 [32];
  EntityComponentStoreTests *local_10;
  EntityComponentStoreTests *this_local;
  
  local_10 = this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_30,"an entity component store with added entities and with components",&local_31)
  ;
  local_70.this = this;
  std::function<void()>::function<EntityComponentStoreTests::Run()::_lambda()_1_,void>
            ((function<void()> *)&local_68,&local_70);
  (*(this->super_TestFixture).super_TestFixtureAbstract._vptr_TestFixtureAbstract[4])
            (this,local_30,&local_68);
  std::function<void_()>::~function(&local_68);
  std::__cxx11::string::~string(local_30);
  std::allocator<char>::~allocator((allocator<char> *)&local_31);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_90,"getting the string component of an entity gives the expected value",&local_91
            );
  local_c0.this = this;
  std::function<void()>::function<EntityComponentStoreTests::Run()::_lambda()_2_,void>
            ((function<void()> *)&local_b8,&local_c0);
  (*(this->super_TestFixture).super_TestFixtureAbstract._vptr_TestFixtureAbstract[6])
            (this,local_90,&local_b8);
  std::function<void_()>::~function(&local_b8);
  std::__cxx11::string::~string(local_90);
  std::allocator<char>::~allocator((allocator<char> *)&local_91);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_e0,"getting the int component of an entity gives the expected value",&local_e1);
  local_110.this = this;
  std::function<void()>::function<EntityComponentStoreTests::Run()::_lambda()_3_,void>
            ((function<void()> *)&local_108,&local_110);
  (*(this->super_TestFixture).super_TestFixtureAbstract._vptr_TestFixtureAbstract[6])
            (this,local_e0,&local_108);
  std::function<void_()>::~function(&local_108);
  std::__cxx11::string::~string(local_e0);
  std::allocator<char>::~allocator((allocator<char> *)&local_e1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_130,
             "getting a component of an entity that does not exist throws the expected exception",
             &local_131);
  local_160.this = this;
  std::function<void()>::function<EntityComponentStoreTests::Run()::_lambda()_4_,void>
            ((function<void()> *)&local_158,&local_160);
  (*(this->super_TestFixture).super_TestFixtureAbstract._vptr_TestFixtureAbstract[6])
            (this,local_130,&local_158);
  std::function<void_()>::~function(&local_158);
  std::__cxx11::string::~string(local_130);
  std::allocator<char>::~allocator((allocator<char> *)&local_131);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_180,
             "getting a component of an entity that does not have that component throws the expected exception"
             ,&local_181);
  local_1b0.this = this;
  std::function<void()>::function<EntityComponentStoreTests::Run()::_lambda()_5_,void>
            ((function<void()> *)&local_1a8,&local_1b0);
  (*(this->super_TestFixture).super_TestFixtureAbstract._vptr_TestFixtureAbstract[6])
            (this,local_180,&local_1a8);
  std::function<void_()>::~function(&local_1a8);
  std::__cxx11::string::~string(local_180);
  std::allocator<char>::~allocator((allocator<char> *)&local_181);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1d0,"getting all entities",&local_1d1);
  local_200.this = this;
  std::function<void()>::function<EntityComponentStoreTests::Run()::_lambda()_6_,void>
            ((function<void()> *)&local_1f8,&local_200);
  (*(this->super_TestFixture).super_TestFixtureAbstract._vptr_TestFixtureAbstract[5])
            (this,local_1d0,&local_1f8);
  std::function<void_()>::~function(&local_1f8);
  std::__cxx11::string::~string(local_1d0);
  std::allocator<char>::~allocator((allocator<char> *)&local_1d1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_220,"the expected entities are returned",&local_221);
  local_250.this = this;
  std::function<void()>::function<EntityComponentStoreTests::Run()::_lambda()_7_,void>
            ((function<void()> *)&local_248,&local_250);
  (*(this->super_TestFixture).super_TestFixtureAbstract._vptr_TestFixtureAbstract[6])
            (this,local_220,&local_248);
  std::function<void_()>::~function(&local_248);
  std::__cxx11::string::~string(local_220);
  std::allocator<char>::~allocator((allocator<char> *)&local_221);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_270,"getting all entities with string components",&local_271);
  local_2a0.this = this;
  std::function<void()>::function<EntityComponentStoreTests::Run()::_lambda()_8_,void>
            ((function<void()> *)&local_298,&local_2a0);
  (*(this->super_TestFixture).super_TestFixtureAbstract._vptr_TestFixtureAbstract[5])
            (this,local_270,&local_298);
  std::function<void_()>::~function(&local_298);
  std::__cxx11::string::~string(local_270);
  std::allocator<char>::~allocator((allocator<char> *)&local_271);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_2c0,"the expected entities are returned",&local_2c1);
  local_2f0.this = this;
  std::function<void()>::function<EntityComponentStoreTests::Run()::_lambda()_9_,void>
            ((function<void()> *)&local_2e8,&local_2f0);
  (*(this->super_TestFixture).super_TestFixtureAbstract._vptr_TestFixtureAbstract[6])
            (this,local_2c0,&local_2e8);
  std::function<void_()>::~function(&local_2e8);
  std::__cxx11::string::~string(local_2c0);
  std::allocator<char>::~allocator((allocator<char> *)&local_2c1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_310,"getting all entities with int components",&local_311);
  local_340.this = this;
  std::function<void()>::function<EntityComponentStoreTests::Run()::_lambda()_10_,void>
            ((function<void()> *)&local_338,&local_340);
  (*(this->super_TestFixture).super_TestFixtureAbstract._vptr_TestFixtureAbstract[5])
            (this,local_310,&local_338);
  std::function<void_()>::~function(&local_338);
  std::__cxx11::string::~string(local_310);
  std::allocator<char>::~allocator((allocator<char> *)&local_311);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_360,"the expected entities are returned",&local_361);
  local_390.this = this;
  std::function<void()>::function<EntityComponentStoreTests::Run()::_lambda()_11_,void>
            ((function<void()> *)&local_388,&local_390);
  (*(this->super_TestFixture).super_TestFixtureAbstract._vptr_TestFixtureAbstract[6])
            (this,local_360,&local_388);
  std::function<void_()>::~function(&local_388);
  std::__cxx11::string::~string(local_360);
  std::allocator<char>::~allocator((allocator<char> *)&local_361);
  return;
}

Assistant:

virtual void Run()
	{
		Given("an entity component store with added entities and with components", [&]() 
		{
			m_entityComponentStore = ecs::EntityComponentStore<int>();
			m_actualEntities = std::vector<int>();

			m_entities = { 1, 2, 3, 4, 5 };
			for (auto entity : m_entities)
				m_entityComponentStore.addEntity(entity);

			m_entitiesWithStringComponent.push_back(m_entities[2]);
			m_entitiesWithIntComponent.push_back(m_entities[2]);
			m_entitiesWithIntComponent.push_back(m_entities[3]);

			m_expectedStringComponentValue = std::string("test_component1");
			m_expectedIntComponentValue = 7;

			for (auto entity : m_entitiesWithStringComponent)
				m_entityComponentStore.addComponent(entity, m_expectedStringComponentValue);

			for (auto entity : m_entitiesWithIntComponent)
				m_entityComponentStore.addComponent(entity, m_expectedIntComponentValue);
		});
		Then("getting the string component of an entity gives the expected value", [&]()
		{
			std::string component = m_entityComponentStore.getComponentOfEntity<std::string>(m_entitiesWithStringComponent[0]);
			AssertThat(component, ut11::Is::EqualTo(m_expectedStringComponentValue));
		});
		Then("getting the int component of an entity gives the expected value", [&]()
		{
			int component = m_entityComponentStore.getComponentOfEntity<int>(m_entitiesWithIntComponent[0]);
			AssertThat(component, ut11::Is::EqualTo(m_expectedIntComponentValue));
		});
		Then("getting a component of an entity that does not exist throws the expected exception", [&]()
		{
			AssertThat([&]() { m_entityComponentStore.getComponentOfEntity<std::string>(100); }, ut11::Will::Throw<ecs::EntityNotFoundException>());
		});
		Then("getting a component of an entity that does not have that component throws the expected exception", [&]()
		{
			AssertThat([&]() { m_entityComponentStore.getComponentOfEntity<std::string>(m_entities[4]); }, ut11::Will::Throw<ecs::ComponentNotFoundException>());
		});
		When("getting all entities", [&]() 
		{
			m_actualEntities = m_entityComponentStore.getAllEntities();
		});
		Then("the expected entities are returned", [&]() 
		{
			AssertThat(m_actualEntities, ut11::Is::Iterable::EquivalentTo(m_entities));
		});
		When("getting all entities with string components", [&]()
		{
			m_actualEntities = m_entityComponentStore.getAllEntitiesFor<std::string>();
		});
		Then("the expected entities are returned", [&]()
		{
			AssertThat(m_actualEntities, ut11::Is::Iterable::EquivalentTo(m_entitiesWithStringComponent));
		});
		When("getting all entities with int components", [&]()
		{
			m_actualEntities = m_entityComponentStore.getAllEntitiesFor<int>();
		});
		Then("the expected entities are returned", [&]()
		{
			AssertThat(m_actualEntities, ut11::Is::Iterable::EquivalentTo(m_entitiesWithIntComponent));
		});
	}